

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::AsmJsByteCodeWriter::AsmStartCall
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,ArgSlot ArgCount,bool isPatching)

{
  ArgSlot local_17;
  byte local_15;
  ArgSlot local_14;
  OpCodeAsmJs local_12;
  OpLayoutStartCall data;
  bool isPatching_local;
  ArgSlot ArgCount_local;
  AsmJsByteCodeWriter *pAStack_10;
  OpCodeAsmJs op_local;
  AsmJsByteCodeWriter *this_local;
  
  local_15 = isPatching;
  local_14 = ArgCount;
  local_12 = op;
  pAStack_10 = this;
  ByteCodeWriter::CheckOpen(&this->super_ByteCodeWriter);
  local_17 = local_14;
  ByteCodeWriter::Data::Encode
            (&(this->super_ByteCodeWriter).m_byteCodeData,local_12,&local_17,2,
             &this->super_ByteCodeWriter,(bool)(local_15 & 1));
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmStartCall(OpCodeAsmJs op, ArgSlot ArgCount, bool isPatching)
    {
        CheckOpen();

        OpLayoutStartCall data;
        data.ArgCount = ArgCount;
        m_byteCodeData.Encode(op, &data, sizeof(data), this, isPatching);
    }